

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O2

int Io_WriteMoPlaOne(FILE *pFile,Abc_Ntk_t *pNtk)

{
  DdManager *dd;
  Vec_Ptr_t *vFuncs;
  Abc_Obj_t *pObj;
  void *Entry;
  DdNode *n;
  int iVar1;
  int i;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
    iVar1 = 0;
    if (dd != (DdManager *)0x0) {
      vFuncs = Vec_PtrAlloc(pNtk->vCos->nSize);
      for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
        pObj = Abc_NtkCo(pNtk,iVar1);
        Entry = Abc_ObjGlobalBdd(pObj);
        Vec_PtrPush(vFuncs,Entry);
      }
      Io_WriteMoPlaOneIntMinterms(pFile,pNtk,dd,vFuncs);
      Abc_NtkFreeGlobalBdds(pNtk,0);
      iVar1 = vFuncs->nSize;
      for (i = 0; i < iVar1; i = i + 1) {
        n = (DdNode *)Vec_PtrEntry(vFuncs,i);
        Cudd_RecursiveDeref(dd,n);
      }
      Vec_PtrFree(vFuncs);
      Extra_StopManager(dd);
      iVar1 = 1;
    }
    return iVar1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                ,0x188,"int Io_WriteMoPlaOne(FILE *, Abc_Ntk_t *)");
}

Assistant:

int Io_WriteMoPlaOne( FILE * pFile, Abc_Ntk_t * pNtk )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
    if ( dd == NULL )
        return 0;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // consider minterms
    Io_WriteMoPlaOneIntMinterms( pFile, pNtk, dd, vFuncsGlob );
    Abc_NtkFreeGlobalBdds( pNtk, 0 );

    // cleanup
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    return 1;
}